

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O2

int Gia_ManBmcPerformInt(Gia_Man_t *pGia,Bmc_AndPar_t *pPars)

{
  uint uVar1;
  sat_solver *psVar2;
  Gia_Obj_t *pGVar3;
  Vec_Int_t *p;
  ulong uVar4;
  uint uVar5;
  abctime aVar6;
  Bmc_Mna_t *p_00;
  abctime aVar7;
  Gia_Man_t *pGVar8;
  Gia_Man_t *pGVar9;
  Aig_Man_t *pAig;
  Cnf_Dat_t *pCVar10;
  Gia_Obj_t *pObj;
  Abc_Cex_t *pAVar11;
  int iVar12;
  Gia_Obj_t *pGVar13;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar14;
  abctime time;
  abctime time_00;
  abctime time_01;
  uint v;
  char *pcVar15;
  uint uVar16;
  uint uVar17;
  double dVar18;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 uVar19;
  int Lit;
  Bmc_AndPar_t *local_58;
  int local_4c;
  int local_48;
  int local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  Lit = 1;
  aVar6 = Abc_Clock();
  p_00 = Bmc_MnaAlloc();
  psVar2 = p_00->pSat;
  iVar14 = pPars->nTimeOut;
  if ((long)iVar14 == 0) {
    aVar7 = 0;
  }
  else {
    aVar7 = Abc_Clock();
    aVar7 = aVar7 + (long)iVar14 * 1000000;
  }
  psVar2->nRuntimeLimit = aVar7;
  pGVar8 = Gia_ManBmcUnroll(pGia,pPars->nFramesMax,pPars->nFramesAdd,pPars->fVeryVerbose,
                            &p_00->vPiMap);
  p_00->pFrames = pGVar8;
  uVar4 = (long)(pGVar8->vCos->nSize - pGVar8->nRegs) / (long)(pGia->vCos->nSize - pGia->nRegs);
  pcVar15 = (char *)(uVar4 & 0xffffffff);
  uVar16 = (uint)uVar4;
  if (pPars->fVerbose != 0) {
    uVar5 = Gia_ManBmcFindFirst(pGVar8);
    printf("Unfolding for %d frames with first non-trivial PO %d.  ",pcVar15,(ulong)uVar5);
    aVar7 = Abc_Clock();
    Abc_PrintTime((int)aVar7 - (int)aVar6,pcVar15,time);
  }
  iVar14 = pPars->fVerbose;
  if (pPars->fUseSynth == 0) {
    if (iVar14 != 0) {
      Gia_ManPrintStats(pGVar8,(Gps_Par_t *)0x0);
    }
  }
  else {
    in_stack_ffffffffffffff88 = CONCAT44((int)((ulong)in_stack_ffffffffffffff88 >> 0x20),iVar14);
    pGVar9 = Gia_ManAigSyn2(pGVar8,1,0,0,0,0,iVar14,0);
    p_00->pFrames = pGVar9;
    Gia_ManStop(pGVar8);
    pGVar8 = pGVar9;
  }
  if (pPars->fDumpFrames != 0) {
    Gia_AigerWrite(pGVar8,"frames.aig",0,0,0);
    puts("Dumped unfolded frames into file \"frames.aig\".");
  }
  if (pPars->fUseOldCnf == 0) {
    pCVar10 = (Cnf_Dat_t *)Mf_ManGenerateCnf(pGVar8,pPars->nLutSize,1,0,0,pPars->fVerbose);
    iVar14 = extraout_EDX_00;
  }
  else {
    pAig = Gia_ManToAigSimple(pGVar8);
    pCVar10 = Cnf_DeriveOther(pAig,1);
    Aig_ManStop(pAig);
    iVar14 = extraout_EDX;
  }
  p_00->pCnf = pCVar10;
  Vec_IntFillExtra(p_00->vId2Var,pGVar8->nObjs,iVar14);
  if ((int)uVar16 < 1) {
    uVar16 = 0;
  }
  uVar5 = 0;
  local_58 = pPars;
  do {
    if (uVar5 == uVar16) {
LAB_0047f5e7:
      iVar14 = -1;
LAB_0047f651:
      Gia_ManStop(p_00->pFrames);
      Bmc_MnaFree(p_00);
      return iVar14;
    }
    iVar14 = pGia->vCos->nSize - pGia->nRegs;
    uVar1 = uVar5 + 1;
    iVar14 = Gia_ManBmcCheckOutputs(p_00->pFrames,iVar14 * uVar5,iVar14 * uVar1);
    if (iVar14 == 0) {
      iVar14 = pGia->vCos->nSize - pGia->nRegs;
      Gia_ManBmcAddCnfNew(p_00,iVar14 * uVar5,iVar14 * uVar1);
      iVar14 = pGia->vCos->nSize;
      iVar12 = pGia->nRegs;
      for (v = (iVar14 - iVar12) * uVar5; (int)v < (int)((iVar14 - iVar12) * uVar1); v = v + 1) {
        pObj = Gia_ManPo(p_00->pFrames,v);
        pGVar13 = (Gia_Obj_t *)
                  ((ulong)((uint)*(undefined8 *)pObj >> 0x1d & 1) ^
                  (ulong)(pObj + -(ulong)((uint)*(undefined8 *)pObj & 0x1fffffff)));
        pGVar3 = p_00->pFrames->pObjs;
        if (pGVar3 != pGVar13) {
          if (((ulong)pGVar13 ^ (ulong)pGVar3) == 1) {
            printf("Output %d is trivially SAT.\n",(ulong)v);
          }
          else {
            p = p_00->vId2Var;
            iVar14 = Gia_ObjId(p_00->pFrames,pObj);
            iVar14 = Vec_IntEntry(p,iVar14);
            uVar17 = 0;
            Lit = Abc_Var2Lit(iVar14,0);
            in_stack_ffffffffffffff88 = 0;
            iVar14 = sat_solver_solve(p_00->pSat,&Lit,(lit *)&local_58,(long)local_58->nConfLimit,0,
                                      0,0);
            if (iVar14 != -1) {
              if (iVar14 != 1) {
                uVar17 = iVar14 == 0 | 0xfffffffe;
              }
              goto LAB_0047f4f8;
            }
          }
        }
        iVar14 = pGia->vCos->nSize;
        iVar12 = pGia->nRegs;
      }
      uVar17 = 0xfffffffe;
LAB_0047f4f8:
      uVar19 = (undefined4)((ulong)in_stack_ffffffffffffff88 >> 0x20);
      if (local_58->fVerbose != 0) {
        pGVar8 = p_00->pFrames;
        local_34 = pGVar8->vCis->nSize - pGVar8->nRegs;
        local_38 = Gia_ManAndNum(pGVar8);
        local_3c = p_00->nSatVars - 1;
        local_40 = p_00->vInputs->nSize;
        local_44 = p_00->vNodes->nSize;
        local_48 = sat_solver_nclauses(p_00->pSat);
        local_4c = sat_solver_nconflicts(p_00->pSat);
        dVar18 = Gia_ManMemory(p_00->pFrames);
        in_stack_ffffffffffffff88 = CONCAT44(uVar19,local_44);
        pcVar15 = (char *)(ulong)uVar5;
        printf("%4d :  PI =%9d.  AIG =%9d.  Var =%8d.  In =%6d.  And =%9d.  Cla =%9d.  Conf =%9d.  Mem =%7.1f MB   "
               ,dVar18 * 9.5367431640625e-07,pcVar15,(ulong)local_34,(ulong)local_38,(ulong)local_3c
               ,(ulong)local_40,in_stack_ffffffffffffff88,local_48,local_4c);
        aVar6 = Abc_Clock();
        Abc_PrintTime((int)aVar6 - (int)p_00->clkStart,pcVar15,time_00);
      }
      if (uVar17 != 0xfffffffe) {
        if (uVar17 != 0xffffffff) {
          if (pGia->pCexSeq != (Abc_Cex_t *)0x0) {
            free(pGia->pCexSeq);
            pGia->pCexSeq = (Abc_Cex_t *)0x0;
          }
          pAVar11 = Gia_ManBmcCexGen(p_00,pGia,v);
          pGia->pCexSeq = pAVar11;
          pcVar15 = (char *)(ulong)((pGia->nRegs - pGia->vCos->nSize) * uVar5 + v);
          iVar14 = 0;
          printf("Output %d of miter \"%s\" was asserted in frame %d.  ",pcVar15,pGia->pName,
                 (ulong)uVar5);
          aVar6 = Abc_Clock();
          Abc_PrintTime((int)aVar6 - (int)p_00->clkStart,pcVar15,time_01);
          goto LAB_0047f651;
        }
        printf("SAT solver reached conflict/runtime limit in frame %d.\n",(ulong)uVar5);
        goto LAB_0047f5e7;
      }
    }
    local_58->iFrame = uVar5;
    uVar5 = uVar1;
  } while( true );
}

Assistant:

int Gia_ManBmcPerformInt( Gia_Man_t * pGia, Bmc_AndPar_t * pPars )
{
    Bmc_Mna_t * p;
    Gia_Man_t * pTemp;
    int nFramesMax, f, i=0, Lit = 1, status, RetValue = -2;
    abctime clk = Abc_Clock();
    p = Bmc_MnaAlloc();
    sat_solver_set_runtime_limit( p->pSat, pPars->nTimeOut ? pPars->nTimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0 );
    p->pFrames = Gia_ManBmcUnroll( pGia, pPars->nFramesMax, pPars->nFramesAdd, pPars->fVeryVerbose, &p->vPiMap );
    nFramesMax = Gia_ManPoNum(p->pFrames) / Gia_ManPoNum(pGia);
    if ( pPars->fVerbose )
    {
        printf( "Unfolding for %d frames with first non-trivial PO %d.  ", nFramesMax, Gia_ManBmcFindFirst(p->pFrames) );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    if ( pPars->fUseSynth )
    {
        p->pFrames = Gia_ManAigSyn2( pTemp = p->pFrames, 1, 0, 0, 0, 0, pPars->fVerbose, 0 );  Gia_ManStop( pTemp );
    }
    else if ( pPars->fVerbose )
        Gia_ManPrintStats( p->pFrames, NULL );
    if ( pPars->fDumpFrames )
    {
        Gia_AigerWrite( p->pFrames, "frames.aig", 0, 0, 0 );
        printf( "Dumped unfolded frames into file \"frames.aig\".\n" );
    }
    if ( pPars->fUseOldCnf )
        p->pCnf = Cnf_DeriveGia( p->pFrames );
    else
    {
//        p->pFrames = Jf_ManDeriveCnf( pTemp = p->pFrames, 1 );  Gia_ManStop( pTemp );
//        p->pCnf = (Cnf_Dat_t *)p->pFrames->pData; p->pFrames->pData = NULL;
        p->pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( p->pFrames, pPars->nLutSize, 1, 0, 0, pPars->fVerbose );
    }
    Vec_IntFillExtra( p->vId2Var, Gia_ManObjNum(p->pFrames), 0 );
    // create clauses for constant node
//    sat_solver_addclause( p->pSat, &Lit, &Lit + 1 );
    for ( f = 0; f < nFramesMax; f++ )
    {
        if ( !Gia_ManBmcCheckOutputs( p->pFrames, f * Gia_ManPoNum(pGia), (f+1) * Gia_ManPoNum(pGia) ) )
        {
            // create another slice
            Gia_ManBmcAddCnfNew( p, f * Gia_ManPoNum(pGia), (f+1) * Gia_ManPoNum(pGia) );
            // try solving the outputs
            for ( i = f * Gia_ManPoNum(pGia); i < (f+1) * Gia_ManPoNum(pGia); i++ )
            {
                Gia_Obj_t * pObj = Gia_ManPo(p->pFrames, i);
                if ( Gia_ObjChild0(pObj) == Gia_ManConst0(p->pFrames) )
                    continue;
                if ( Gia_ObjChild0(pObj) == Gia_ManConst1(p->pFrames) )
                {
                    printf( "Output %d is trivially SAT.\n", i );
                    continue;
                }
                Lit = Abc_Var2Lit( Vec_IntEntry(p->vId2Var, Gia_ObjId(p->pFrames, pObj)), 0 );
                status = sat_solver_solve( p->pSat, &Lit, &Lit + 1, (ABC_INT64_T)pPars->nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
                if ( status == l_False ) // unsat
                    continue;
                if ( status == l_True )  // sat
                    RetValue = 0;
                if ( status == l_Undef ) // undecided
                    RetValue = -1;
                break;
            }
            // report statistics
            if ( pPars->fVerbose )
            {
                printf( "%4d :  PI =%9d.  AIG =%9d.  Var =%8d.  In =%6d.  And =%9d.  Cla =%9d.  Conf =%9d.  Mem =%7.1f MB   ", 
                    f, Gia_ManPiNum(p->pFrames), Gia_ManAndNum(p->pFrames), 
                    p->nSatVars-1, Vec_IntSize(p->vInputs), Vec_IntSize(p->vNodes), 
                    sat_solver_nclauses(p->pSat), sat_solver_nconflicts(p->pSat), Gia_ManMemory(p->pFrames)/(1<<20) );
                Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
            }
        }
        if ( RetValue != -2 )
        {
            if ( RetValue == -1 )
                printf( "SAT solver reached conflict/runtime limit in frame %d.\n", f );
            else
            {
                ABC_FREE( pGia->pCexSeq );
                pGia->pCexSeq = Gia_ManBmcCexGen( p, pGia, i );
                printf( "Output %d of miter \"%s\" was asserted in frame %d.  ", 
                    i - f * Gia_ManPoNum(pGia), Gia_ManName(pGia), f );
                Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
            }
            break;
        }
        pPars->iFrame = f;
    }
    if ( RetValue == -2 )
        RetValue = -1;
    // cleanup
    Gia_ManStop( p->pFrames );
    Bmc_MnaFree( p );
    return RetValue;
}